

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.cc
# Opt level: O3

bool __thiscall sptk::ScalarOperation::AddLogarithmOperation(ScalarOperation *this,double base)

{
  pointer *pppMVar1;
  iterator __position;
  ModuleInterface *pMVar2;
  _func_int **pp_Var3;
  double dVar4;
  ModuleInterface *local_20;
  
  if (0.0 < base) {
    pMVar2 = (ModuleInterface *)operator_new(0x10);
    pp_Var3 = (_func_int **)operator_new(0x10);
    *pp_Var3 = (_func_int *)&PTR__OperationInterface_001167e0;
    dVar4 = log(base);
    pp_Var3[1] = (_func_int *)(1.0 / dVar4);
    pMVar2->_vptr_ModuleInterface = (_func_int **)&PTR__OperationPerformer_001164a0;
    pMVar2[1]._vptr_ModuleInterface = pp_Var3;
    __position._M_current =
         (this->modules_).
         super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->modules_).
        super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_20 = pMVar2;
      std::
      vector<sptk::ScalarOperation::ModuleInterface*,std::allocator<sptk::ScalarOperation::ModuleInterface*>>
      ::_M_realloc_insert<sptk::ScalarOperation::ModuleInterface*>
                ((vector<sptk::ScalarOperation::ModuleInterface*,std::allocator<sptk::ScalarOperation::ModuleInterface*>>
                  *)&this->modules_,__position,&local_20);
    }
    else {
      *__position._M_current = pMVar2;
      pppMVar1 = &(this->modules_).
                  super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppMVar1 = *pppMVar1 + 1;
    }
  }
  return 0.0 < base;
}

Assistant:

bool ScalarOperation::AddLogarithmOperation(double base) {
  if (base <= 0.0) return false;
  modules_.push_back(new OperationPerformer(new Logarithm(base)));
  return true;
}